

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

void uv__iou_submit(uv__iou *iou)

{
  int iVar1;
  int *piVar2;
  uint32_t flags;
  uv__iou *iou_local;
  
  *iou->sqtail = *iou->sqtail + 1;
  if ((((*iou->sqflags & 1) != 0) && (iVar1 = uv__io_uring_enter(iou->ringfd,0,0,2), iVar1 != 0)) &&
     (piVar2 = __errno_location(), *piVar2 != 0x82)) {
    perror("libuv: io_uring_enter(wakeup)");
  }
  return;
}

Assistant:

static void uv__iou_submit(struct uv__iou* iou) {
  uint32_t flags;

  atomic_store_explicit((_Atomic uint32_t*) iou->sqtail,
                        *iou->sqtail + 1,
                        memory_order_release);

  flags = atomic_load_explicit((_Atomic uint32_t*) iou->sqflags,
                               memory_order_acquire);

  if (flags & UV__IORING_SQ_NEED_WAKEUP)
    if (uv__io_uring_enter(iou->ringfd, 0, 0, UV__IORING_ENTER_SQ_WAKEUP))
      if (errno != EOWNERDEAD)  /* Kernel bug. Harmless, ignore. */
        perror("libuv: io_uring_enter(wakeup)");  /* Can't happen. */
}